

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O2

int CmdCommandQuit(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"hs");
  if (iVar1 == 0x73) {
    iVar1 = -2;
  }
  else if ((iVar1 == -1) && (globalUtilOptind == argc)) {
    iVar1 = -1;
  }
  else {
    fwrite("usage: quit [-sh]\n",0x12,1,(FILE *)pAbc->Err);
    fwrite("   -h  print the command usage\n",0x1f,1,(FILE *)pAbc->Err);
    fwrite("   -s  frees all the memory before quitting\n",0x2c,1,(FILE *)pAbc->Err);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int CmdCommandQuit( Abc_Frame_t * pAbc, int argc, char **argv )
{
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "hs" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
            break;
        case 's':
            return -2;
            break;
        default:
            goto usage;
        }
    }

    if ( argc != globalUtilOptind )
        goto usage;
    return -1;

  usage:
    fprintf( pAbc->Err, "usage: quit [-sh]\n" );
    fprintf( pAbc->Err, "   -h  print the command usage\n" );
    fprintf( pAbc->Err, "   -s  frees all the memory before quitting\n" );
    return 1;
}